

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O2

int ssymm_(char *side,char *uplo,integer *m,integer *n,real *alpha,real *a,integer *lda,real *b,
          integer *ldb,real *beta,real *c__,integer *ldc)

{
  float fVar1;
  int iVar2;
  int iVar3;
  integer iVar4;
  logical lVar5;
  logical lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  real *prVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  integer *piVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  real *prVar25;
  ulong uVar26;
  real *prVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  
  iVar12 = *lda;
  uVar7 = (ulong)iVar12;
  iVar2 = *ldb;
  uVar8 = (ulong)iVar2;
  uVar9 = (ulong)*ldc;
  lVar5 = lsame_(side,"L");
  piVar20 = m;
  if (lVar5 == 0) {
    piVar20 = n;
  }
  iVar16 = *piVar20;
  lVar5 = lsame_(uplo,"U");
  ssymm_::info = 0;
  lVar6 = lsame_(side,"L");
  if ((lVar6 != 0) || (lVar6 = lsame_(side,"R"), iVar4 = 1, lVar6 != 0)) {
    if ((lVar5 == 0) && (lVar6 = lsame_(uplo,"L"), lVar6 == 0)) {
      iVar4 = 2;
    }
    else {
      iVar17 = *m;
      if (iVar17 < 0) {
        iVar4 = 3;
      }
      else {
        uVar28 = *n;
        if ((int)uVar28 < 0) {
          iVar4 = 4;
        }
        else {
          if (iVar16 < 2) {
            iVar16 = 1;
          }
          if (*lda < iVar16) {
            iVar4 = 7;
          }
          else {
            iVar16 = iVar17 + (uint)(iVar17 == 0);
            if (*ldb < iVar16) {
              iVar4 = 9;
            }
            else if (*ldc < iVar16) {
              iVar4 = 0xc;
            }
            else {
              iVar4 = ssymm_::info;
              if (ssymm_::info == 0) {
                if ((ulong)uVar28 == 0 || iVar17 == 0) {
                  return 0;
                }
                uVar21 = ~uVar9;
                if ((*alpha != 0.0) || (NAN(*alpha))) {
                  uVar24 = ~uVar7;
                  uVar29 = ~uVar8;
                  lVar6 = lsame_(side,"L");
                  iVar16 = *n;
                  iVar17 = iVar12 + 1;
                  if (iVar16 < 1) {
                    iVar16 = 0;
                  }
                  uVar14 = (ulong)(iVar16 + 1);
                  if (lVar6 != 0) {
                    if (lVar5 != 0) {
                      prVar13 = b + uVar8 + uVar29 + 1;
                      prVar27 = c__ + uVar9 + uVar21 + 1;
                      for (uVar30 = 1; uVar30 != uVar14; uVar30 = uVar30 + 1) {
                        iVar12 = *m;
                        lVar18 = uVar30 * uVar9;
                        if (iVar12 < 1) {
                          iVar12 = 0;
                        }
                        lVar10 = 0;
                        prVar25 = a + uVar24 + uVar7 + 1;
                        for (uVar11 = 1; uVar11 != iVar12 + 1; uVar11 = uVar11 + 1) {
                          fVar32 = *alpha * b[uVar29 + uVar30 * uVar8 + uVar11];
                          fVar31 = 0.0;
                          for (lVar22 = 0; lVar10 != lVar22; lVar22 = lVar22 + 1) {
                            prVar27[lVar22] = prVar25[lVar22] * fVar32 + prVar27[lVar22];
                            fVar31 = fVar31 + prVar13[lVar22] * prVar25[lVar22];
                          }
                          fVar1 = *beta;
                          if ((fVar1 != 0.0) || (NAN(fVar1))) {
                            c__[uVar21 + lVar18 + uVar11] =
                                 fVar31 * *alpha +
                                 fVar1 * c__[uVar21 + lVar18 + uVar11] +
                                 fVar32 * a[uVar24 + (long)(iVar17 * (int)uVar11)];
                          }
                          else {
                            c__[uVar21 + lVar18 + uVar11] =
                                 fVar32 * a[uVar24 + (long)(iVar17 * (int)uVar11)] + fVar31 * *alpha
                            ;
                          }
                          prVar25 = prVar25 + uVar7;
                          lVar10 = lVar10 + 1;
                        }
                        prVar13 = prVar13 + uVar8;
                        prVar27 = prVar27 + uVar9;
                      }
                      return 0;
                    }
                    for (uVar30 = 1; uVar30 != uVar14; uVar30 = uVar30 + 1) {
                      lVar18 = uVar30 * uVar9;
                      for (uVar11 = (ulong)*m; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
                        fVar31 = *alpha * b[uVar29 + uVar30 * uVar8 + uVar11];
                        iVar12 = *m;
                        fVar32 = 0.0;
                        uVar15 = uVar11 & 0xffffffff;
                        while ((int)uVar15 < iVar12) {
                          uVar28 = (int)uVar15 + 1;
                          lVar10 = (long)(int)uVar28;
                          c__[uVar21 + lVar18 + lVar10] =
                               a[uVar24 + uVar11 * uVar7 + lVar10] * fVar31 +
                               c__[uVar21 + lVar18 + lVar10];
                          fVar32 = fVar32 + b[uVar29 + uVar30 * uVar8 + lVar10] *
                                            a[uVar24 + uVar11 * uVar7 + lVar10];
                          uVar15 = (ulong)uVar28;
                        }
                        fVar1 = *beta;
                        if ((fVar1 != 0.0) || (NAN(fVar1))) {
                          c__[uVar21 + lVar18 + uVar11] =
                               fVar32 * *alpha +
                               fVar1 * c__[uVar21 + lVar18 + uVar11] +
                               fVar31 * a[uVar24 + (long)(iVar17 * (int)uVar11)];
                        }
                        else {
                          c__[uVar21 + lVar18 + uVar11] =
                               fVar31 * a[uVar24 + (long)(iVar17 * (int)uVar11)] + fVar32 * *alpha;
                        }
                      }
                    }
                    return 0;
                  }
                  iVar16 = 1;
                  if (lVar5 != 0) {
                    iVar16 = iVar12;
                  }
                  prVar13 = c__ + uVar21 + uVar9 + 1;
                  iVar12 = iVar2 * 2;
                  prVar27 = b + uVar29 + uVar8 + 1;
                  for (uVar30 = 1; uVar30 != uVar14; uVar30 = uVar30 + 1) {
                    fVar31 = *alpha;
                    fVar32 = a[uVar24 + (long)(iVar17 * (int)uVar30)];
                    uVar28 = *m;
                    if (*m < 1) {
                      uVar28 = 0;
                    }
                    if ((*beta != 0.0) || (NAN(*beta))) {
                      for (uVar11 = 0; uVar28 != uVar11; uVar11 = uVar11 + 1) {
                        prVar13[uVar11] =
                             *beta * prVar13[uVar11] + prVar27[uVar11] * fVar31 * fVar32;
                      }
                    }
                    else {
                      for (uVar11 = 0; uVar28 != uVar11; uVar11 = uVar11 + 1) {
                        prVar13[uVar11] = prVar27[uVar11] * fVar31 * fVar32;
                      }
                    }
                    lVar18 = uVar30 * uVar9;
                    prVar25 = b + uVar29 + uVar8 + 1;
                    for (uVar11 = 1; uVar11 != uVar30; uVar11 = uVar11 + 1) {
                      lVar10 = uVar30 * uVar7 + uVar11;
                      if (lVar5 == 0) {
                        lVar10 = uVar30 + uVar11 * uVar7;
                      }
                      fVar31 = *alpha;
                      fVar32 = a[uVar24 + lVar10];
                      uVar15 = (ulong)(uint)*m;
                      if (*m < 1) {
                        uVar15 = 0;
                      }
                      for (uVar19 = 0; uVar15 != uVar19; uVar19 = uVar19 + 1) {
                        c__[uVar21 + lVar18 + uVar19 + 1] =
                             prVar25[uVar19] * fVar31 * fVar32 + c__[uVar21 + lVar18 + uVar19 + 1];
                      }
                      prVar25 = prVar25 + uVar8;
                    }
                    uVar11 = uVar30 * uVar7;
                    if (lVar5 != 0) {
                      uVar11 = uVar30;
                    }
                    iVar3 = *n;
                    uVar15 = uVar30 & 0xffffffff;
                    iVar23 = iVar12;
                    while( true ) {
                      if (iVar3 <= (int)uVar15) break;
                      uVar28 = (int)uVar15 + 1;
                      uVar15 = (ulong)uVar28;
                      fVar31 = *alpha;
                      fVar32 = a[uVar24 + uVar11 + (long)(int)(uVar28 * iVar16)];
                      uVar19 = (ulong)(uint)*m;
                      if (*m < 1) {
                        uVar19 = 0;
                      }
                      for (uVar26 = 0; uVar19 != uVar26; uVar26 = uVar26 + 1) {
                        c__[uVar21 + lVar18 + uVar26 + 1] =
                             b[uVar29 + (long)iVar23 + uVar26 + 1] * fVar31 * fVar32 +
                             c__[uVar21 + lVar18 + uVar26 + 1];
                      }
                      iVar23 = iVar23 + iVar2;
                    }
                    prVar27 = prVar27 + uVar8;
                    prVar13 = prVar13 + uVar9;
                    iVar12 = iVar12 + iVar2;
                  }
                  return 0;
                }
                fVar31 = *beta;
                if ((fVar31 == 1.0) && (!NAN(fVar31))) {
                  return 0;
                }
                lVar10 = (ulong)uVar28 + 1;
                prVar13 = c__ + uVar9 + uVar21 + 1;
                lVar18 = 1;
                if ((fVar31 == 0.0) && (!NAN(fVar31))) {
                  for (; lVar18 != lVar10; lVar18 = lVar18 + 1) {
                    uVar7 = (ulong)(uint)*m;
                    if (*m < 1) {
                      uVar7 = 0;
                    }
                    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
                      prVar13[uVar8] = 0.0;
                    }
                    prVar13 = prVar13 + uVar9;
                  }
                  return 0;
                }
                for (; lVar18 != lVar10; lVar18 = lVar18 + 1) {
                  uVar7 = (ulong)(uint)*m;
                  if (*m < 1) {
                    uVar7 = 0;
                  }
                  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
                    prVar13[uVar8] = *beta * prVar13[uVar8];
                  }
                  prVar13 = prVar13 + uVar9;
                }
                return 0;
              }
            }
          }
        }
      }
    }
  }
  ssymm_::info = iVar4;
  xerbla_("SSYMM ",&ssymm_::info);
  return 0;
}

Assistant:

int ssymm_(char *side, char *uplo, integer *m, integer *n,
	real *alpha, real *a, integer *lda, real *b, integer *ldb, real *beta,
	 real *c__, integer *ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, c_dim1, c_offset, i__1, i__2,
	    i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp1, temp2;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYMM  performs one of the matrix-matrix operations

       C := alpha*A*B + beta*C,

    or

       C := alpha*B*A + beta*C,

    where alpha and beta are scalars,  A is a symmetric matrix and  B and
    C are  m by n matrices.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry,  SIDE  specifies whether  the  symmetric matrix  A
             appears on the  left or right  in the  operation as follows:

                SIDE = 'L' or 'l'   C := alpha*A*B + beta*C,

                SIDE = 'R' or 'r'   C := alpha*B*A + beta*C,

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of  the  symmetric  matrix   A  is  to  be
             referenced as follows:

                UPLO = 'U' or 'u'   Only the upper triangular part of the
                                    symmetric matrix is to be referenced.

                UPLO = 'L' or 'l'   Only the lower triangular part of the
                                    symmetric matrix is to be referenced.

             Unchanged on exit.

    M      - INTEGER.
             On entry,  M  specifies the number of rows of the matrix  C.
             M  must be at least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of the matrix C.
             N  must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             m  when  SIDE = 'L' or 'l'  and is  n otherwise.
             Before entry  with  SIDE = 'L' or 'l',  the  m by m  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading m by m upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  m by m  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Before entry  with  SIDE = 'R' or 'r',  the  n by n  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading n by n upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  n by n  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA must be at least  max( 1, m ), otherwise  LDA must be at
             least  max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry, the leading  m by n part of the array  B  must
             contain the matrix B.
             Unchanged on exit.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry,  BETA  specifies the scalar  beta.  When  BETA  is
             supplied as zero then C need not be set on input.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry, the leading  m by n  part of the array  C must
             contain the matrix  C,  except when  beta  is zero, in which
             case C need not be set on entry.
             On exit, the array  C  is overwritten by the  m by n updated
             matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Set NROWA as the number of rows of A.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(side, "L")) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    upper = lsame_(uplo, "U");

/*     Test the input parameters. */

    info = 0;
    if (! lsame_(side, "L") && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (*m < 0) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldb < max(1,*m)) {
	info = 9;
    } else if (*ldc < max(1,*m)) {
	info = 12;
    }
    if (info != 0) {
	xerbla_("SSYMM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (*alpha == 0.f && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (*beta == 0.f) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		}
/* L20: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		}
/* L40: */
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(side, "L")) {

/*        Form  C := alpha*A*B + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__3 = i__ - 1;
		    for (k = 1; k <= i__3; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L50: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L60: */
		}
/* L70: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		for (i__ = *m; i__ >= 1; --i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__2 = *m;
		    for (k = i__ + 1; k <= i__2; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L80: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L90: */
		}
/* L100: */
	    }
	}
    } else {

/*        Form  C := alpha*B*A + beta*C. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    temp1 = *alpha * a[j + j * a_dim1];
	    if (*beta == 0.f) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = temp1 * b[i__ + j * b_dim1];
/* L110: */
		}
	    } else {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1] +
			    temp1 * b[i__ + j * b_dim1];
/* L120: */
		}
	    }
	    i__2 = j - 1;
	    for (k = 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[k + j * a_dim1];
		} else {
		    temp1 = *alpha * a[j + k * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L130: */
		}
/* L140: */
	    }
	    i__2 = *n;
	    for (k = j + 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[j + k * a_dim1];
		} else {
		    temp1 = *alpha * a[k + j * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L150: */
		}
/* L160: */
	    }
/* L170: */
	}
    }

    return 0;

/*     End of SSYMM . */

}